

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O0

global_object_create_result *
mjs::make_string_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  undefined8 uVar1;
  version vVar2;
  global_object *pgVar3;
  gc_heap *h_00;
  gc_heap_ptr<mjs::gc_string> *name;
  string_object *psVar4;
  anon_class_8_1_54a39808_for_f f;
  anon_class_24_2_466402c2_for_f local_348;
  basic_string_view<char,_std::char_traits<char>_> local_330;
  string local_320;
  gc_heap_ptr<mjs::object> local_310;
  anon_class_24_2_466402c2_for_f local_300;
  basic_string_view<char,_std::char_traits<char>_> local_2e8;
  string local_2d8;
  gc_heap_ptr<mjs::object> local_2c8;
  anon_class_16_1_570cf4e1_for_f local_2b8;
  anon_class_16_1_570cf4e1_for_f local_2a8;
  anon_class_16_1_570cf4e1_for_f local_298 [2];
  uint32_t local_278;
  undefined4 uStack_274;
  gc_heap *local_270;
  gc_heap *local_268;
  gc_heap *local_260;
  uint32_t local_258;
  undefined4 uStack_254;
  anon_class_8_1_54a39808_for_f local_250;
  anon_class_8_1_54a39808_for_f to_upper;
  anon_class_8_1_54a39808_for_f to_lower;
  anon_class_16_1_570cf4e1_for_f local_238 [3];
  __0 local_208 [8];
  anon_class_24_3_e06c2290 make_string_function;
  string local_1d0;
  gc_heap_ptr<mjs::object> local_1c0;
  anon_class_32_1_7e9391cf_for_f local_1b0;
  string local_190;
  gc_heap_ptr<mjs::object> local_180;
  undefined1 local_170 [8];
  anon_class_32_2_842af841 check_type;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  string local_138;
  gc_heap_ptr<mjs::object> local_128;
  gc_heap_ptr<mjs::object> local_118;
  value local_108;
  string local_e0;
  anon_class_16_1_570cf4e1_for_f local_d0;
  undefined1 local_c0 [16];
  anon_class_8_1_54a39808_for_f local_b0;
  undefined1 local_a8 [8];
  gc_heap_ptr<mjs::function_object> c;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  string local_80 [2];
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  undefined1 local_30 [8];
  gc_heap_ptr<mjs::string_object> prototype;
  gc_heap *h;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  h_00 = object::heap(&pgVar3->super_object);
  prototype.super_gc_heap_ptr_untyped._8_8_ = h_00;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"String");
  string::string(&local_40,h_00,&local_50);
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar3->super_object)._vptr_object[0xb])(&local_60);
  uVar1 = prototype.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,"");
  string::string(local_80,(gc_heap *)uVar1,&local_90);
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  vVar2 = global_object::language_version(pgVar3);
  c.super_gc_heap_ptr_untyped._15_1_ = 1 < (int)vVar2;
  gc_heap::make<mjs::string_object,mjs::string,mjs::gc_heap_ptr<mjs::object>,mjs::string,bool>
            ((gc_heap *)local_30,(string *)h_00,(gc_heap_ptr<mjs::object> *)&local_40,&local_60,
             (bool *)local_80);
  string::~string(local_80);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)&local_60);
  string::~string(&local_40);
  local_b0.h = (gc_heap *)prototype.super_gc_heap_ptr_untyped._8_8_;
  gc_heap_ptr<mjs::string_object>::operator->((gc_heap_ptr<mjs::string_object> *)local_30);
  object::class_name((object *)local_c0);
  name = string::unsafe_raw_get((string *)local_c0);
  make_function<mjs::make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__15>
            ((mjs *)local_a8,global,&local_b0,name,1);
  string::~string((string *)local_c0);
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_d0.global,global);
  make_constructable<mjs::make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__16>
            (global,(gc_heap_ptr<mjs::function_object> *)local_a8,&local_d0);
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_16::~__16((__16 *)&local_d0);
  psVar4 = gc_heap_ptr<mjs::string_object>::operator->((gc_heap_ptr<mjs::string_object> *)local_30);
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar3->super_object)._vptr_object[0x13])(&local_e0,pgVar3,"constructor");
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            (&local_118,(gc_heap_ptr<mjs::function_object> *)local_a8);
  value::value(&local_108,&local_118);
  (*(psVar4->super_native_object).super_object._vptr_object[1])(psVar4,&local_e0,&local_108,2);
  value::~value(&local_108);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_118);
  string::~string(&local_e0);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            (&local_128,(gc_heap_ptr<mjs::function_object> *)local_a8);
  uVar1 = prototype.super_gc_heap_ptr_untyped._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_148,"fromCharCode");
  string::string(&local_138,(gc_heap *)uVar1,&local_148);
  check_type.prototype.super_gc_heap_ptr_untyped.pos_ = prototype.super_gc_heap_ptr_untyped.pos_;
  check_type.prototype.super_gc_heap_ptr_untyped._12_4_ = prototype.super_gc_heap_ptr_untyped._12_4_
  ;
  put_native_function<mjs::make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__17>
            (global,&local_128,&local_138,
             (anon_class_8_1_54a39808_for_f *)&check_type.prototype.super_gc_heap_ptr_untyped.pos_,0
            );
  string::~string(&local_138);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_128);
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr((gc_heap_ptr<mjs::global_object> *)local_170,global);
  gc_heap_ptr<mjs::string_object>::gc_heap_ptr
            ((gc_heap_ptr<mjs::string_object> *)&check_type.global.super_gc_heap_ptr_untyped.pos_,
             (gc_heap_ptr<mjs::string_object> *)local_30);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::string_object,void>
            (&local_180,(gc_heap_ptr<mjs::string_object> *)local_30);
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar3->super_object)._vptr_object[0x13])(&local_190,pgVar3,"toString");
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_19::__19
            ((__19 *)&local_1b0,(anon_class_32_2_842af841 *)local_170);
  put_native_function<mjs::make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__18>
            (global,&local_180,&local_190,&local_1b0,0);
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_18::~__18((__18 *)&local_1b0);
  string::~string(&local_190);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_180);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::string_object,void>
            (&local_1c0,(gc_heap_ptr<mjs::string_object> *)local_30);
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar3->super_object)._vptr_object[0x13])(&local_1d0,pgVar3,"valueOf");
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_19::__19
            ((__19 *)&make_string_function.prototype,(anon_class_32_2_842af841 *)local_170);
  put_native_function<mjs::make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__20>
            (global,&local_1c0,&local_1d0,
             (anon_class_32_1_7e9391cf_for_f *)&make_string_function.prototype,0);
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_20::~__20
            ((__20 *)&make_string_function.prototype);
  string::~string(&local_1d0);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_1c0);
  local_208 = (__0  [8])prototype.super_gc_heap_ptr_untyped._8_8_;
  make_string_function.global = (gc_heap_ptr<mjs::global_object> *)local_30;
  local_238[2].global.super_gc_heap_ptr_untyped.pos_ = prototype.super_gc_heap_ptr_untyped.pos_;
  local_238[2].global.super_gc_heap_ptr_untyped._12_4_ = prototype.super_gc_heap_ptr_untyped._12_4_;
  f.h = (gc_heap *)prototype.super_gc_heap_ptr_untyped._8_8_;
  make_string_function.h = (gc_heap *)global;
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (local_208,"charAt",1,
             (anon_class_8_1_54a39808_for_f)prototype.super_gc_heap_ptr_untyped._8_8_);
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (local_208,"charCodeAt",1,f);
  local_238[1].global.super_gc_heap_ptr_untyped.pos_ = prototype.super_gc_heap_ptr_untyped.pos_;
  local_238[1].global.super_gc_heap_ptr_untyped._12_4_ = prototype.super_gc_heap_ptr_untyped._12_4_;
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (local_208,"indexOf",2,
             (anon_class_8_1_54a39808_for_f)prototype.super_gc_heap_ptr_untyped._8_8_);
  local_238[1].global.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)prototype.super_gc_heap_ptr_untyped._8_8_;
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (local_208,"lastIndexOf",2,
             (anon_class_8_1_54a39808_for_f)prototype.super_gc_heap_ptr_untyped._8_8_);
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_238[0].global,global);
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (local_208,"split",1,local_238);
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_5::~__5((__5 *)local_238);
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (local_208,"substring",1,
             (anon_class_8_1_54a39808_for_f)prototype.super_gc_heap_ptr_untyped._8_8_);
  to_upper.h = (gc_heap *)prototype.super_gc_heap_ptr_untyped._8_8_;
  local_250.h = (gc_heap *)prototype.super_gc_heap_ptr_untyped._8_8_;
  local_258 = prototype.super_gc_heap_ptr_untyped.pos_;
  uStack_254 = prototype.super_gc_heap_ptr_untyped._12_4_;
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (local_208,"toLowerCase",0,
             (anon_class_8_1_54a39808_for_f)prototype.super_gc_heap_ptr_untyped._8_8_);
  local_260 = local_250.h;
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (local_208,"toUpperCase",0,local_250);
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  vVar2 = global_object::language_version(pgVar3);
  if (0 < (int)vVar2) {
    local_268 = to_upper.h;
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              (local_208,"toLocaleLowerCase",0,to_upper);
    local_270 = local_250.h;
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              (local_208,"toLocaleUpperCase",0,local_250);
    local_278 = prototype.super_gc_heap_ptr_untyped.pos_;
    uStack_274 = prototype.super_gc_heap_ptr_untyped._12_4_;
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              (local_208,"localeCompare",1,
               (anon_class_8_1_54a39808_for_f)prototype.super_gc_heap_ptr_untyped._8_8_);
    local_298[1].global.super_gc_heap_ptr_untyped.pos_ = prototype.super_gc_heap_ptr_untyped.pos_;
    local_298[1].global.super_gc_heap_ptr_untyped._12_4_ =
         prototype.super_gc_heap_ptr_untyped._12_4_;
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              (local_208,"concat",1,
               (anon_class_8_1_54a39808_for_f)prototype.super_gc_heap_ptr_untyped._8_8_);
    local_298[1].global.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)prototype.super_gc_heap_ptr_untyped._8_8_;
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              (local_208,"slice",2,
               (anon_class_8_1_54a39808_for_f)prototype.super_gc_heap_ptr_untyped._8_8_);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_298[0].global,global);
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              (local_208,"match",1,local_298);
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_12::~__12((__12 *)local_298);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_2a8.global,global);
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              (local_208,"search",1,&local_2a8);
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_13::~__13((__13 *)&local_2a8);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_2b8.global,global);
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
              (local_208,"replace",2,&local_2b8);
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_14::~__14((__14 *)&local_2b8);
  }
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  vVar2 = global_object::language_version(pgVar3);
  if (1 < (int)vVar2) {
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::string_object,void>
              (&local_2c8,(gc_heap_ptr<mjs::string_object> *)local_30);
    uVar1 = prototype.super_gc_heap_ptr_untyped._8_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2e8,"trim");
    string::string(&local_2d8,(gc_heap *)uVar1,&local_2e8);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_300.global,global);
    pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
    local_300.ver = global_object::language_version(pgVar3);
    put_native_function<mjs::make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__21>
              (global,&local_2c8,&local_2d8,&local_300,0);
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_21::~__21((__21 *)&local_300);
    string::~string(&local_2d8);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_2c8);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::string_object,void>
              (&local_310,(gc_heap_ptr<mjs::string_object> *)local_30);
    uVar1 = prototype.super_gc_heap_ptr_untyped._8_8_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_330,"substr");
    string::string(&local_320,(gc_heap *)uVar1,&local_330);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_348.global,global);
    pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
    local_348.ver = global_object::language_version(pgVar3);
    put_native_function<mjs::make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__22>
              (global,&local_310,&local_320,&local_348,2);
    make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_22::~__22((__22 *)&local_348);
    string::~string(&local_320);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_310);
  }
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            (&__return_storage_ptr__->obj,(gc_heap_ptr<mjs::function_object> *)local_a8);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::string_object,void>
            (&__return_storage_ptr__->prototype,(gc_heap_ptr<mjs::string_object> *)local_30);
  make_string_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_19::~__19((__19 *)local_170);
  gc_heap_ptr<mjs::function_object>::~gc_heap_ptr((gc_heap_ptr<mjs::function_object> *)local_a8);
  gc_heap_ptr<mjs::string_object>::~gc_heap_ptr((gc_heap_ptr<mjs::string_object> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

global_object_create_result make_string_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global->heap();
    auto prototype = h.make<string_object>(string{h, "String"}, global->object_prototype(), string{h, ""}, global->language_version() >= version::es5);

    auto c = make_function(global, [&h](const value&, const std::vector<value>& args) {
        return value{args.empty() ? string{h, ""} : to_string(h, args.front())};
    }, prototype->class_name().unsafe_raw_get(), 1);
    make_constructable(global, c, [global](const value&, const std::vector<value>& args) {
        auto& h = global->heap();
        return value{new_string(global, args.empty() ? string{h, ""} : to_string(h, args.front()))};
    });

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    put_native_function(global, c, string{h, "fromCharCode"}, [&h](const value&, const std::vector<value>& args){
        std::wstring s;
        for (const auto& a: args) {
            s.push_back(to_uint16(a));
        }
        return value{string{h, s}};
    }, 0);

    auto check_type = [global, prototype](const value& this_) {
        global->validate_type(this_, prototype, "String");
    };

    put_native_function(global, prototype, global->common_string("toString"), [check_type](const value& this_, const std::vector<value>&){
        check_type(this_);
        return value{static_cast<const string_object&>(*this_.object_value()).string_value()};
    }, 0);
    put_native_function(global, prototype, global->common_string("valueOf"), [check_type](const value& this_, const std::vector<value>&){
        check_type(this_);
        return value{static_cast<const string_object&>(*this_.object_value()).string_value()};
    }, 0);


    auto make_string_function = [&](const char* name, int num_args, auto f) {
        put_native_function(global, prototype, string{h, name}, [&h, f](const value& this_, const std::vector<value>& args){
            return value{f(to_string(h, this_), args)};
        }, num_args);
    };

    make_string_function("charAt", 1, [&h](const string& s, const std::vector<value>& args){
        const int position = to_int32(get_arg(args, 0));
        if (position < 0 || position >= static_cast<int>(s.view().length())) {
            return string{h, ""};
        }
        return string{h, s.view().substr(position, 1)};
    });

    make_string_function("charCodeAt", 1, [](const string& s, const std::vector<value>& args){
        const int position = to_int32(get_arg(args, 0));
        if (position < 0 || position >= static_cast<int>(s.view().length())) {
            return static_cast<double>(NAN);
        }
        return static_cast<double>(s.view()[position]);
    });

    make_string_function("indexOf", 2, [&h](const string& s, const std::vector<value>& args){
        const auto& search_string = to_string(h, get_arg(args, 0));
        const int position = to_int32(get_arg(args, 1));
        auto index = s.view().find(search_string.view(), position);
        return index == std::wstring_view::npos ? -1. : static_cast<double>(index);
    });

    make_string_function("lastIndexOf", 2, [&h](const string& s, const std::vector<value>& args){
        const auto& search_string = to_string(h, get_arg(args, 0));
        double position = to_number(get_arg(args, 1));
        const int ipos = std::isnan(position) ? INT_MAX : to_int32(position);
        auto index = s.view().rfind(search_string.view(), ipos);
        return index == std::wstring_view::npos ? -1. : static_cast<double>(index);
    });

    make_string_function("split", 1, [global](const string& str, const std::vector<value>& args){
        const auto s = str.view();
        auto& h = global->heap();
        auto a = make_array(global, 0);
        if (args.empty()) {
            a->put(string{h, index_string(0)}, value{string{h, s}});
        } else {
            const auto sep = to_string(h, args.front());
            if (sep.view().empty()) {
                for (uint32_t i = 0; i < s.length(); ++i) {
                    a->put(string{h, index_string(i)}, value{string{ h, s.substr(i,1) }});
                }
            } else {
                size_t pos = 0;
                uint32_t i = 0;
                for (; pos < s.length(); ++i) {
                    const auto next_pos = s.find(sep.view(), pos);
                    if (next_pos == std::wstring_view::npos) {
                        break;
                    }
                    a->put(string{h, index_string(i)}, value{string{ h, s.substr(pos, next_pos-pos) }});
                    pos = next_pos + 1;
                }
                if (pos < s.length()) {
                    a->put(string{h, index_string(i)}, value{string{ h, s.substr(pos) }});
                }
            }
        }
        return a;
    });

    make_string_function("substring", 1, [&h](const string& str, const std::vector<value>& args) {
        const auto s = str.view();
        int start = std::min(std::max(to_int32(get_arg(args, 0)), 0), static_cast<int>(s.length()));
        if (args.size() < 2) {
            return string{h, s.substr(start)};
        }
        int end = std::min(std::max(to_int32(get_arg(args, 1)), 0), static_cast<int>(s.length()));
        if (start > end) {
            std::swap(start, end);
        }
        return string{h, s.substr(start, end-start)};
    });

    auto to_lower = [&h](const string& s, const std::vector<value>&){
        std::wstring res;
        for (auto c: s.view()) {
            res.push_back(towlower(c));
        }
        return string{h, res};
    };

    auto to_upper = [&h](const string& s, const std::vector<value>&){
        std::wstring res;
        for (auto c: s.view()) {
            res.push_back(towupper(c));
        }
        return string{h, res};
    };

    make_string_function("toLowerCase", 0, to_lower);
    make_string_function("toUpperCase", 0, to_upper);

    if (global->language_version() >= version::es3) {
        make_string_function("toLocaleLowerCase", 0, to_lower);
        make_string_function("toLocaleUpperCase", 0, to_upper);
        make_string_function("localeCompare", 1, [&h](const string& s, const std::vector<value>& args){
            const auto res = s.view().compare(to_string(h, get_arg(args, 0)).view());
            return value{ static_cast<double>(res < 0 ? 1 : res > 0 ? -1 : 0) };
        });
        make_string_function("concat", 1, [&h](const string& s, const std::vector<value>& args) {
            std::wstring res{s.view()};
            for (const auto& a: args) {
                res += to_string(h, a).view();
            }
            return value{string{h, res}};
        });
        make_string_function("slice", 2, [&h](const string& str, const std::vector<value>& args) {
            const auto s = str.view();
            const auto l = static_cast<uint32_t>(s.length());
            const auto ns = to_integer(get_arg(args, 0));
            const auto& end_arg = get_arg(args, 1);
            const auto ne = end_arg.type() == value_type::undefined ? l : to_integer(end_arg);
            const auto start = static_cast<uint32_t>(ns < 0 ? std::max(l + ns, 0.0) : std::min(ns, 0.0+l));
            const auto end   = static_cast<uint32_t>(ne < 0 ? std::max(l + ne, 0.0) : std::min(ne, 0.0+l));
            return value{string{h, s.substr(start, start < end ? end - start : 0)}};
        });
        make_string_function("match", 1, [global](const string& s, const std::vector<value>& args) {
            return string_match(global, s, get_arg(args, 0));
        });
        make_string_function("search", 1, [global](const string& s, const std::vector<value>& args) {
            return string_search(global, s, get_arg(args, 0));
        });
        make_string_function("replace", 2, [global](const string& s, const std::vector<value>& args) {
            return string_replace(global, s, get_arg(args, 0), get_arg(args, 1));
        });
    }
    if (global->language_version() >= version::es5) {
        put_native_function(global, prototype, string{h, "trim"}, [global, ver = global->language_version()](const value& this_, const std::vector<value>&) {
            // CheckObjectCoercible
            if (this_.type() == value_type::undefined || this_.type() == value_type::null) {
                std::ostringstream oss;
                oss << "String.prototype.trim cannot be called on " << this_.type();
                throw native_error_exception(native_error_type::type, global->stack_trace(), oss.str());
            }
            auto& h = global->heap();
            auto s = to_string(h, this_);
            return value{string{h, trim(s.view(), ver)}};
        }, 0);

        put_native_function(global, prototype, string{h, "substr"}, [global, ver = global->language_version()](const value& this_, const std::vector<value>& args) {
            // ES5.1, B.2.3
            auto& h = global.heap();
            // 1
            const auto str = to_string(h, this_);
            // 2
            auto start  = to_integer(args.size() >= 1 ? args[0] : value::undefined);
            // 3
            auto length = args.size() < 2 || args[1].type() == value_type::undefined ? +INFINITY : to_integer(args[1]);
            // 4
            const auto str_len = str.view().length();
            // 5
            if (start < 0) start = std::max(str_len + start, 0.);
            // 6
            length = std::min(std::max(length, 0.), str_len - start);
            // 7
            if (length <= 0) return value{string{h, ""}};
            // 8
            return value{string{h, str.view().substr(static_cast<size_t>(start), static_cast<size_t>(length))}};
        }, 2);
    }

    return {c, prototype};
}